

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator*
          (TPZFMatrix<Fad<float>_> *__return_storage_ptr__,TPZFMatrix<Fad<float>_> *this,
          Fad<float> *value)

{
  uint uVar1;
  ulong uVar2;
  Fad<float> local_38;
  
  TPZFMatrix(__return_storage_ptr__,this);
  local_38.val_ = value->val_;
  uVar1 = (value->dx_).num_elts;
  local_38.dx_.ptr_to_data = (float *)0x0;
  local_38.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = (long)(int)uVar1 * 4;
    }
    local_38.dx_.ptr_to_data = (float *)operator_new__(uVar2);
    MEM_CPY<float>::copy
              ((MEM_CPY<float> *)local_38.dx_.ptr_to_data,(EVP_PKEY_CTX *)(value->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_38.defaultVal = value->defaultVal;
  operator*=(__return_storage_ptr__,&local_38);
  Fad<float>::~Fad(&local_38);
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar>
TPZFMatrix<TVar>::operator*(const TVar value ) const
{
    auto res(*this);
    res *= value;
    return res;
}